

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int64_t bgzf_seek(BGZF *fp,int64_t pos,int where)

{
  off_t oVar1;
  
  if ((*(uint *)fp & 0x30000) == 0 && where == 0) {
    oVar1 = hseek(fp->fp,pos >> 0x10,0);
    if (-1 < oVar1) {
      fp->block_length = 0;
      fp->block_address = pos >> 0x10;
      fp->block_offset = (uint)pos & 0xffff;
      return 0;
    }
    *(byte *)fp = *(byte *)fp | 4;
  }
  else {
    *(uint *)fp = *(uint *)fp | 8;
  }
  return -1;
}

Assistant:

int64_t bgzf_seek(BGZF* fp, int64_t pos, int where)
{
    int block_offset;
    int64_t block_address;

    if (fp->is_write || where != SEEK_SET) {
        fp->errcode |= BGZF_ERR_MISUSE;
        return -1;
    }
    block_offset = pos & 0xFFFF;
    block_address = pos >> 16;
    if (hseek(fp->fp, block_address, SEEK_SET) < 0) {
        fp->errcode |= BGZF_ERR_IO;
        return -1;
    }
    fp->block_length = 0;  // indicates current block has not been loaded
    fp->block_address = block_address;
    fp->block_offset = block_offset;
    return 0;
}